

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int EmitRescaledYUV(VP8Io *io,WebPDecParams *p)

{
  WEBP_CSP_MODE WVar1;
  WebPRescaler *wrk;
  int iVar2;
  int new_lines;
  
  iVar2 = io->mb_h;
  wrk = p->scaler_y;
  WVar1 = p->output->colorspace;
  if ((((WVar1 < MODE_LAST) && ((0x103aU >> (WVar1 & 0x1f) & 1) != 0)) ||
      (0xfffffffb < WVar1 - MODE_YUV)) && (io->a != (uint8_t *)0x0)) {
    WebPMultRows(io->y,io->y_stride,io->a,io->width,io->mb_w,iVar2,0);
  }
  new_lines = iVar2 + 1 >> 1;
  iVar2 = Rescale(io->y,io->y_stride,iVar2,wrk);
  Rescale(io->u,io->uv_stride,new_lines,p->scaler_u);
  Rescale(io->v,io->uv_stride,new_lines,p->scaler_v);
  return iVar2;
}

Assistant:

static int EmitRescaledYUV(const VP8Io* const io, WebPDecParams* const p) {
  const int mb_h = io->mb_h;
  const int uv_mb_h = (mb_h + 1) >> 1;
  WebPRescaler* const scaler = p->scaler_y;
  int num_lines_out = 0;
  if (WebPIsAlphaMode(p->output->colorspace) && io->a != NULL) {
    // Before rescaling, we premultiply the luma directly into the io->y
    // internal buffer. This is OK since these samples are not used for
    // intra-prediction (the top samples are saved in cache_y/u/v).
    // But we need to cast the const away, though.
    WebPMultRows((uint8_t*)io->y, io->y_stride,
                 io->a, io->width, io->mb_w, mb_h, 0);
  }
  num_lines_out = Rescale(io->y, io->y_stride, mb_h, scaler);
  Rescale(io->u, io->uv_stride, uv_mb_h, p->scaler_u);
  Rescale(io->v, io->uv_stride, uv_mb_h, p->scaler_v);
  return num_lines_out;
}